

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlSBufAddString(xmlSBuf *buf,xmlChar *str,uint len)

{
  int iVar1;
  
  if (buf->max - buf->size < len) {
    if (buf->code == XML_ERR_OK) {
      buf->code = XML_ERR_RESOURCE_LIMIT;
    }
  }
  else {
    if ((buf->cap - buf->size <= len) && (iVar1 = xmlSBufGrow(buf,len), iVar1 < 0)) {
      return;
    }
    if (len != 0) {
      memcpy(buf->mem + buf->size,str,(ulong)len);
    }
    buf->size = buf->size + len;
  }
  return;
}

Assistant:

static void
xmlSBufAddString(xmlSBuf *buf, const xmlChar *str, unsigned len) {
    if (buf->max - buf->size < len) {
        if (buf->code == XML_ERR_OK)
            buf->code = XML_ERR_RESOURCE_LIMIT;
        return;
    }

    if (buf->cap - buf->size <= len) {
        if (xmlSBufGrow(buf, len) < 0)
            return;
    }

    if (len > 0)
        memcpy(buf->mem + buf->size, str, len);
    buf->size += len;
}